

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O1

vm_obj_id_t CVmObjBigNum::createu(int in_root_set,ulong val,size_t digits)

{
  vm_obj_id_t obj_id;
  CVmObjBigNum *this;
  
  obj_id = CVmObjTable::alloc_obj(&G_obj_table_X,in_root_set,0,0);
  this = (CVmObjBigNum *)CVmObject::operator_new(0x10,obj_id);
  (this->super_CVmObject)._vptr_CVmObject = (_func_int **)&PTR_get_metaclass_reg_00351740;
  alloc_bignum(this,digits);
  set_uint_val(*(char **)((long)&G_obj_table_X.pages_[obj_id >> 0xc][obj_id & 0xfff].ptr_ + 8),val);
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjBigNum::createu(VMG_ int in_root_set,
                                  ulong val, size_t digits)
{
    vm_obj_id_t id = vm_new_id(vmg_ in_root_set, FALSE, FALSE);
    new (vmg_ id) CVmObjBigNum(vmg_ digits);
    set_uint_val(((CVmObjBigNum *)vm_objp(vmg_ id))->get_ext(), val);
    return id;
}